

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_CELL *ppRVar4;
  undefined8 uVar5;
  uint cell;
  char *pcVar6;
  uint unaff_R12D;
  ulong uVar7;
  long lVar8;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ppRVar4 = ref_grid->cell + 3;
  if (ref_grid->twod == 0) {
    ppRVar4 = ref_grid->cell + 8;
  }
  ref_cell = *ppRVar4;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar7].ref;
    ref_node = ref_grid->node;
    do {
      uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1bd,"ref_validation_cell_volume_at_node",(ulong)uVar3,"nodes");
        return uVar3;
      }
      if (ref_grid->twod == 0) {
        uVar3 = ref_node_tet_vol(ref_node,local_a8,&local_b0);
        if (uVar3 != 0) {
          uVar5 = 0x1c1;
          pcVar6 = "vol";
          goto LAB_00215cd8;
        }
      }
      else {
        uVar3 = ref_node_tri_area(ref_node,local_a8,&local_b0);
        if (uVar3 != 0) {
          uVar5 = 0x1bf;
          pcVar6 = "area";
LAB_00215cd8:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,uVar5,"ref_validation_cell_volume_at_node",(ulong)uVar3,pcVar6);
          unaff_R12D = uVar3;
        }
      }
      if (uVar3 != 0) {
        return unaff_R12D;
      }
      if (local_b0 <= 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1c8,"ref_validation_cell_volume_at_node","negative volume tet");
        printf("cell %d volume %e\n",local_b0,(ulong)cell);
        if (ref_cell->node_per < 1) {
          return 1;
        }
        lVar8 = 0;
        do {
          ref_node_location(ref_node,local_a8[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < ref_cell->node_per);
        return 1;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar7].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        cell = 0xffffffff;
      }
      else {
        cell = pRVar2[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,
                                                      REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}